

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep.cc
# Opt level: O0

void __thiscall
p2t::Sweep::FlipEdgeEvent(Sweep *this,SweepContext *tcx,Point *ep,Point *eq,Triangle *t,Point *p)

{
  bool bVar1;
  Orientation o_00;
  Triangle *pTVar2;
  Point *pPVar3;
  Point *pb;
  Point *pc;
  Point *newP;
  Orientation o;
  Point *op;
  Triangle *ot;
  Point *p_local;
  Triangle *t_local;
  Point *eq_local;
  Point *ep_local;
  SweepContext *tcx_local;
  Sweep *this_local;
  
  pTVar2 = Triangle::NeighborAcross(t,p);
  pPVar3 = Triangle::OppositePoint(pTVar2,t,p);
  pb = Triangle::PointCCW(t,p);
  pc = Triangle::PointCW(t,p);
  bVar1 = InScanArea(p,pb,pc,pPVar3);
  if (bVar1) {
    RotateTrianglePair(this,t,p,pTVar2,pPVar3);
    SweepContext::MapTriangleToNodes(tcx,t);
    SweepContext::MapTriangleToNodes(tcx,pTVar2);
    bVar1 = p2t::operator==(p,eq);
    if ((bVar1) && (bVar1 = p2t::operator==(pPVar3,ep), bVar1)) {
      bVar1 = p2t::operator==(eq,((tcx->edge_event).constrained_edge)->q);
      if ((bVar1) && (bVar1 = p2t::operator==(ep,((tcx->edge_event).constrained_edge)->p), bVar1)) {
        Triangle::MarkConstrainedEdge(t,ep,eq);
        Triangle::MarkConstrainedEdge(pTVar2,ep,eq);
        Legalize(this,tcx,t);
        Legalize(this,tcx,pTVar2);
      }
    }
    else {
      o_00 = Orient2d(eq,pPVar3,ep);
      pTVar2 = NextFlipTriangle(this,tcx,o_00,t,pTVar2,p,pPVar3);
      FlipEdgeEvent(this,tcx,ep,eq,pTVar2,p);
    }
  }
  else {
    pPVar3 = NextFlipPoint(this,ep,eq,pTVar2,pPVar3);
    FlipScanEdgeEvent(this,tcx,ep,eq,t,pTVar2,pPVar3);
    EdgeEvent(this,tcx,ep,eq,t,p);
  }
  return;
}

Assistant:

void Sweep::FlipEdgeEvent(SweepContext& tcx, Point& ep, Point& eq, Triangle* t, Point& p)
{
  Triangle& ot = t->NeighborAcross(p);
  Point& op = *ot.OppositePoint(*t, p);

  if (InScanArea(p, *t->PointCCW(p), *t->PointCW(p), op)) {
    // Lets rotate shared edge one vertex CW
    RotateTrianglePair(*t, p, ot, op);
    tcx.MapTriangleToNodes(*t);
    tcx.MapTriangleToNodes(ot);

    if (p == eq && op == ep) {
      if (eq == *tcx.edge_event.constrained_edge->q && ep == *tcx.edge_event.constrained_edge->p) {
        t->MarkConstrainedEdge(&ep, &eq);
        ot.MarkConstrainedEdge(&ep, &eq);
        Legalize(tcx, *t);
        Legalize(tcx, ot);
      } else {
        // XXX: I think one of the triangles should be legalized here?
      }
    } else {
      Orientation o = Orient2d(eq, op, ep);
      t = &NextFlipTriangle(tcx, (int)o, *t, ot, p, op);
      FlipEdgeEvent(tcx, ep, eq, t, p);
    }
  } else {
    Point& newP = NextFlipPoint(ep, eq, ot, op);
    FlipScanEdgeEvent(tcx, ep, eq, *t, ot, newP);
    EdgeEvent(tcx, ep, eq, t, p);
  }
}